

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::layoutObjectCheck(TParseContext *this,TSourceLoc *loc,TSymbol *symbol)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TQualifier *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TTypeList *pTVar3;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TType *type;
  undefined4 extraout_var_00;
  
  iVar2 = (*symbol->_vptr_TSymbol[0xc])(symbol);
  type = (TType *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*type->_vptr_TType[0xb])(type);
  this_00 = (TQualifier *)CONCAT44(extraout_var_00,iVar2);
  layoutTypeCheck(this,loc,type);
  if (((*(ulong *)&this_00->field_0x1c & 0xff000000007fff) != 0xff000000004fff) &&
     ((*(uint *)&this_00->field_0x8 & 0x7f) - 5 < 2)) {
    iVar2 = (*symbol->_vptr_TSymbol[10])(symbol);
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only be used on variable declaration","location","");
    }
  }
  if ((((((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) &&
        ((this->super_TParseContextBase).parsingBuiltins == false)) &&
       ((*(ulong *)&this_00->field_0x8 & 0xff80) == 0)) &&
      (((~*(uint *)&this_00->field_0x1c & 0xfff) == 0 &&
       (((this->super_TParseContextBase).super_TParseVersions.intermediate)->autoMapLocations ==
        false)))) && (((uint)*(ulong *)&this_00->field_0x8 & 0x7f) - 3 < 2)) {
    iVar2 = (*type->_vptr_TType[0xb])(type);
    if ((*(byte *)(CONCAT44(extraout_var_02,iVar2) + 0xd) & 8) == 0) {
      iVar2 = (*type->_vptr_TType[0xb])(type);
      if (*(long *)(CONCAT44(extraout_var_03,iVar2) + 0x40) == 0) {
        iVar2 = (*type->_vptr_TType[7])(type);
        if (iVar2 == 0x10) {
          pTVar3 = TType::getStruct(type);
          iVar2 = (*((pTVar3->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[10])();
          if ((~*(uint *)(CONCAT44(extraout_var_04,iVar2) + 0x1c) & 0xfff) != 0) goto LAB_003a7a18;
          pTVar3 = TType::getStruct(type);
          iVar2 = (*((pTVar3->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[10])();
          if ((*(ushort *)(CONCAT44(extraout_var_05,iVar2) + 8) & 0xff80) != 0) goto LAB_003a7a18;
        }
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"SPIR-V requires location for user input/output","location","");
      }
    }
  }
LAB_003a7a18:
  bVar1 = TQualifier::hasUniformLayout(this_00);
  if ((bVar1) && ((*(uint *)&this_00->field_0x8 & 0x7f) - 5 < 2)) {
    iVar2 = (*type->_vptr_TType[7])(type);
    if (iVar2 != 0x10) {
      if (*(ulong *)&this_00->field_0x8 >> 0x3d != 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot specify matrix layout on a variable declaration","layout","");
      }
      if ((this_00->field_0x10 & 0xf) != 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot specify packing on a variable declaration","layout","");
      }
      if ((this_00->layoutOffset != -1) && (type->field_0x8 != '\r')) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot specify on a variable declaration","offset","");
      }
      if (this_00->layoutAlign != -1) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot specify on a variable declaration","align","");
      }
      if (this_00->layoutPushConstant == true) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"can only specify on a uniform block","push_constant","");
      }
      if (this_00->layoutShaderRecord == true) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"can only specify on a buffer block","shaderRecordNV","");
      }
      if (((~*(uint *)&this_00->field_0x1c & 0xfff) != 0) && (type->field_0x8 == '\r')) {
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        (*UNRECOVERED_JUMPTABLE)
                  (this,loc,"cannot specify on atomic counter","location","",UNRECOVERED_JUMPTABLE);
        return;
      }
    }
  }
  return;
}

Assistant:

void TParseContext::layoutObjectCheck(const TSourceLoc& loc, const TSymbol& symbol)
{
    const TType& type = symbol.getType();
    const TQualifier& qualifier = type.getQualifier();

    // first, cross check WRT to just the type
    layoutTypeCheck(loc, type);

    // now, any remaining error checking based on the object itself

    if (qualifier.hasAnyLocation()) {
        switch (qualifier.storage) {
        case EvqUniform:
        case EvqBuffer:
            if (symbol.getAsVariable() == nullptr)
                error(loc, "can only be used on variable declaration", "location", "");
            break;
        default:
            break;
        }
    }

    // user-variable location check, which are required for SPIR-V in/out:
    //  - variables have it directly,
    //  - blocks have it on each member (already enforced), so check first one
    if (spvVersion.spv > 0 && !parsingBuiltins && qualifier.builtIn == EbvNone &&
        !qualifier.hasLocation() && !intermediate.getAutoMapLocations()) {

        switch (qualifier.storage) {
        case EvqVaryingIn:
        case EvqVaryingOut:
            if (!type.getQualifier().isTaskMemory() && !type.getQualifier().hasSpirvDecorate() &&
                (type.getBasicType() != EbtBlock ||
                 (!(*type.getStruct())[0].type->getQualifier().hasLocation() &&
                   (*type.getStruct())[0].type->getQualifier().builtIn == EbvNone)))
                error(loc, "SPIR-V requires location for user input/output", "location", "");
            break;
        default:
            break;
        }
    }

    // Check packing and matrix
    if (qualifier.hasUniformLayout()) {
        switch (qualifier.storage) {
        case EvqUniform:
        case EvqBuffer:
            if (type.getBasicType() != EbtBlock) {
                if (qualifier.hasMatrix())
                    error(loc, "cannot specify matrix layout on a variable declaration", "layout", "");
                if (qualifier.hasPacking())
                    error(loc, "cannot specify packing on a variable declaration", "layout", "");
                // "The offset qualifier can only be used on block members of blocks..."
                if (qualifier.hasOffset() && !type.isAtomic())
                    error(loc, "cannot specify on a variable declaration", "offset", "");
                // "The align qualifier can only be used on blocks or block members..."
                if (qualifier.hasAlign())
                    error(loc, "cannot specify on a variable declaration", "align", "");
                if (qualifier.isPushConstant())
                    error(loc, "can only specify on a uniform block", "push_constant", "");
                if (qualifier.isShaderRecord())
                    error(loc, "can only specify on a buffer block", "shaderRecordNV", "");
                if (qualifier.hasLocation() && type.isAtomic())
                    error(loc, "cannot specify on atomic counter", "location", "");
            }
            break;
        default:
            // these were already filtered by layoutTypeCheck() (or its callees)
            break;
        }
    }
}